

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAdvancedBlendTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationIndexedStateCase::iterate
          (BlendEquationIndexedStateCase *this)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deBool dVar2;
  int iVar3;
  GLenum err;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  NotSupportedError *pNVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  Enum<int,_2UL> EVar8;
  GetNameFunc local_138;
  int local_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  ScopedLogSection local_c0;
  ScopedLogSection section;
  int ndx;
  undefined1 local_90 [8];
  ResultCollector result;
  CallLogWrapper gl;
  BlendEquationIndexedStateCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    do {
      dVar2 = ::deGetFalse();
      if (dVar2 != 0) {
LAB_0227c073:
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar6,"GL_KHR_blend_equation_advanced is not supported",
                   "m_context.getContextInfo().isExtensionSupported(\"GL_KHR_blend_equation_advanced\")"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                   ,0x2d0);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pCVar5 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_KHR_blend_equation_advanced");
      if (!bVar1) goto LAB_0227c073;
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = ::deGetFalse();
      if (dVar2 != 0) {
LAB_0227c122:
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar6,"GL_EXT_draw_buffers_indexed is not supported",
                   "m_context.getContextInfo().isExtensionSupported(\"GL_EXT_draw_buffers_indexed\")"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                   ,0x2d1);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pCVar5 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_draw_buffers_indexed");
      if (!bVar1) goto LAB_0227c122;
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar7);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_90,pTVar7,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  for (section.m_log._0_4_ = 0; (int)section.m_log < this->m_numEquations;
      section.m_log._0_4_ = (int)section.m_log + 1) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Type",&local_e1);
    EVar8 = glu::getBlendEquationStr(this->m_equations[(int)section.m_log]);
    local_138 = EVar8.m_getName;
    local_130 = EVar8.m_value;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_128,(de *)&local_138,EVar8._8_8_);
    std::operator+(&local_108,"Test ",&local_128);
    tcu::ScopedLogSection::ScopedLogSection(&local_c0,pTVar7,&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    glu::CallLogWrapper::glBlendEquationi
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),2,
               this->m_equations[(int)section.m_log]);
    err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    glu::checkError(err,"glBlendEquationi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                    ,0x2de);
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,2,this->m_equations[(int)section.m_log],this->m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_c0);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_90,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_90);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

BlendEquationIndexedStateCase::IterateResult BlendEquationIndexedStateCase::iterate (void)
{
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_KHR_blend_equation_advanced"), "GL_KHR_blend_equation_advanced is not supported");
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"), "GL_EXT_draw_buffers_indexed is not supported");
	}

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	for (int ndx = 0; ndx < m_numEquations; ++ndx)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Type", "Test " + de::toString(glu::getBlendEquationStr(m_equations[ndx])));

		gl.glBlendEquationi(2, m_equations[ndx]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBlendEquationi");

		gls::StateQueryUtil::verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION, 2, m_equations[ndx], m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}